

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
::emplace_new_key<slang::syntax::SyntaxNode_const*>
          (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,SyntaxNode **key)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
  pVar7;
  bool local_69;
  templated_iterator<const_slang::syntax::SyntaxNode_*> local_68;
  iterator result;
  value_type to_insert;
  templated_iterator<const_slang::syntax::SyntaxNode_*> local_50 [3];
  SyntaxNode **local_38;
  SyntaxNode **key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  *this_local;
  bool local_10;
  
  local_38 = key;
  key_local = (SyntaxNode **)current_entry;
  current_entry_local._7_1_ =
       (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
        )distance_from_desired;
  psStack_20 = this;
  if ((*(long *)(this + 0x10) != 0) &&
     ((sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
       )distance_from_desired != this[0x19])) {
    lVar3 = *(long *)(this + 0x20) + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = *(long *)(this + 0x10) + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)*(float *)(this + 0x1c)) {
      bVar1 = sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>::is_empty(current_entry);
      if (bVar1) {
        sherwood_v3_entry<slang::syntax::SyntaxNode_const*>::
        emplace<slang::syntax::SyntaxNode_const*>
                  ((sherwood_v3_entry<slang::syntax::SyntaxNode_const*> *)key_local,
                   (int8_t)current_entry_local._7_1_,local_38);
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
        ::templated_iterator<const_slang::syntax::SyntaxNode_*>::templated_iterator
                  (local_50,(EntryPointer)key_local);
        to_insert._7_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
                            *)&this_local,local_50,(bool *)((long)&to_insert + 7));
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        result.current = (EntryPointer)*local_38;
        std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
        std::swap<slang::syntax::SyntaxNode_const*>((SyntaxNode **)&result,key_local + 1);
        sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
        ::templated_iterator<const_slang::syntax::SyntaxNode_*>::templated_iterator
                  (&local_68,(EntryPointer)key_local);
        current_entry_local._7_1_ =
             (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
              )((char)current_entry_local._7_1_ + '\x01');
        do {
          while( true ) {
            key_local = key_local + 2;
            bVar1 = sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>::is_empty
                              ((sherwood_v3_entry<const_slang::syntax::SyntaxNode_*> *)key_local);
            if (bVar1) {
              sherwood_v3_entry<slang::syntax::SyntaxNode_const*>::
              emplace<slang::syntax::SyntaxNode_const*>
                        ((sherwood_v3_entry<slang::syntax::SyntaxNode_const*> *)key_local,
                         (int8_t)current_entry_local._7_1_,(SyntaxNode **)&result);
              *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
              local_69 = true;
              std::
              pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
              ::
              pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>_&,_bool,_true>
                        ((pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
                          *)&this_local,&local_68,&local_69);
              pVar6._8_8_ = extraout_RDX_00;
              pVar6.first.current = (EntryPointer)this_local;
              goto LAB_0044230d;
            }
            if ((char)current_entry_local._7_1_ <= *(char *)key_local) break;
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::swap<slang::syntax::SyntaxNode_const*>((SyntaxNode **)&result,key_local + 1);
            current_entry_local._7_1_ =
                 (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                  )((char)current_entry_local._7_1_ + '\x01');
          }
          current_entry_local._7_1_ =
               (sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                )((char)current_entry_local._7_1_ + '\x01');
        } while (current_entry_local._7_1_ != this[0x19]);
        std::swap<slang::syntax::SyntaxNode_const*>
                  ((SyntaxNode **)&result,&((local_68.current)->field_1).value);
        sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
        ::grow((sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                *)this);
        pVar6 = emplace<slang::syntax::SyntaxNode_const*>(this,(SyntaxNode **)&result);
        local_10 = pVar6.second;
      }
      goto LAB_0044230d;
    }
  }
  sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  ::grow((sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
          *)this);
  pVar6 = emplace<slang::syntax::SyntaxNode_const*>(this,local_38);
  local_10 = pVar6.second;
LAB_0044230d:
  this_local = (sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }